

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000002948b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000002948b7._0_1_ = '.';
    uRam00000000002948b7._1_1_ = '.';
    uRam00000000002948b7._2_1_ = '.';
    uRam00000000002948b7._3_1_ = '.';
    uRam00000000002948b7._4_1_ = '.';
    uRam00000000002948b7._5_1_ = '.';
    uRam00000000002948b7._6_1_ = '.';
    uRam00000000002948b7._7_1_ = '.';
    DAT_002948a0 = '.';
    DAT_002948a0_1._0_1_ = '.';
    DAT_002948a0_1._1_1_ = '.';
    DAT_002948a0_1._2_1_ = '.';
    DAT_002948a0_1._3_1_ = '.';
    DAT_002948a0_1._4_1_ = '.';
    DAT_002948a0_1._5_1_ = '.';
    DAT_002948a0_1._6_1_ = '.';
    uRam00000000002948a8 = 0x2e2e2e2e2e2e2e;
    DAT_002948af = 0x2e;
    DAT_00294890 = '.';
    DAT_00294890_1._0_1_ = '.';
    DAT_00294890_1._1_1_ = '.';
    DAT_00294890_1._2_1_ = '.';
    DAT_00294890_1._3_1_ = '.';
    DAT_00294890_1._4_1_ = '.';
    DAT_00294890_1._5_1_ = '.';
    DAT_00294890_1._6_1_ = '.';
    uRam0000000000294898._0_1_ = '.';
    uRam0000000000294898._1_1_ = '.';
    uRam0000000000294898._2_1_ = '.';
    uRam0000000000294898._3_1_ = '.';
    uRam0000000000294898._4_1_ = '.';
    uRam0000000000294898._5_1_ = '.';
    uRam0000000000294898._6_1_ = '.';
    uRam0000000000294898._7_1_ = '.';
    DAT_00294880 = '.';
    DAT_00294880_1._0_1_ = '.';
    DAT_00294880_1._1_1_ = '.';
    DAT_00294880_1._2_1_ = '.';
    DAT_00294880_1._3_1_ = '.';
    DAT_00294880_1._4_1_ = '.';
    DAT_00294880_1._5_1_ = '.';
    DAT_00294880_1._6_1_ = '.';
    uRam0000000000294888._0_1_ = '.';
    uRam0000000000294888._1_1_ = '.';
    uRam0000000000294888._2_1_ = '.';
    uRam0000000000294888._3_1_ = '.';
    uRam0000000000294888._4_1_ = '.';
    uRam0000000000294888._5_1_ = '.';
    uRam0000000000294888._6_1_ = '.';
    uRam0000000000294888._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000294878._0_1_ = '.';
    uRam0000000000294878._1_1_ = '.';
    uRam0000000000294878._2_1_ = '.';
    uRam0000000000294878._3_1_ = '.';
    uRam0000000000294878._4_1_ = '.';
    uRam0000000000294878._5_1_ = '.';
    uRam0000000000294878._6_1_ = '.';
    uRam0000000000294878._7_1_ = '.';
    DAT_002948bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}